

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnMemoryFillExpr
          (ExprVisitorDelegate *this,MemoryFillExpr *expr)

{
  WatWriter *this_00;
  char *s;
  NextChar next_char;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::MemoryFill_Opcode);
  WritePutsSpace(this_00,s);
  WriteMemoryVarUnlessZero(this->writer_,&expr->memidx,next_char);
  WriteNewline(this->writer_,false);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnMemoryFillExpr(MemoryFillExpr* expr) {
  writer_->WritePutsSpace(Opcode::MemoryFill_Opcode.GetName());
  writer_->WriteMemoryVarUnlessZero(expr->memidx, NextChar::Space);
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}